

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keylog.c
# Opt level: O0

_Bool Curl_tls_keylog_write_line(char *line)

{
  size_t __n;
  char local_128 [8];
  char buf [256];
  size_t local_20;
  size_t linelen;
  char *line_local;
  
  if ((keylog_file_fp == (FILE *)0x0) || (line == (char *)0x0)) {
    line_local._7_1_ = false;
  }
  else {
    __n = strlen(line);
    if ((__n == 0) || (0xfe < __n)) {
      line_local._7_1_ = false;
    }
    else {
      memcpy(local_128,line,__n);
      local_20 = __n;
      if (line[__n - 1] != '\n') {
        local_20 = __n + 1;
        local_128[__n] = '\n';
      }
      local_128[local_20] = '\0';
      fputs(local_128,(FILE *)keylog_file_fp);
      line_local._7_1_ = true;
    }
  }
  return line_local._7_1_;
}

Assistant:

bool
Curl_tls_keylog_write_line(const char *line)
{
  /* The current maximum valid keylog line length LF and NUL is 195. */
  size_t linelen;
  char buf[256];

  if(!keylog_file_fp || !line) {
    return FALSE;
  }

  linelen = strlen(line);
  if(linelen == 0 || linelen > sizeof(buf) - 2) {
    /* Empty line or too big to fit in a LF and NUL. */
    return FALSE;
  }

  memcpy(buf, line, linelen);
  if(line[linelen - 1] != '\n') {
    buf[linelen++] = '\n';
  }
  buf[linelen] = '\0';

  /* Using fputs here instead of fprintf since libcurl's fprintf replacement
     may not be thread-safe. */
  fputs(buf, keylog_file_fp);
  return TRUE;
}